

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O1

void __thiscall holder::holder(holder *this,string *n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  int iVar5;
  size_type sVar6;
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  pcVar2 = (n->_M_dataplus)._M_p;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar2,pcVar2 + n->_M_string_length)
  ;
  sVar4 = local_40;
  pcVar3 = local_48;
  if (local_40 != 0) {
    sVar6 = 0;
    do {
      iVar5 = tolower((int)pcVar3[sVar6]);
      pcVar3[sVar6] = (char)iVar5;
      sVar6 = sVar6 + 1;
    } while (sVar4 != sVar6);
  }
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  if (local_48 == &local_38) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_37,local_38);
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uStack_30;
  }
  else {
    (this->name)._M_dataplus._M_p = local_48;
    (this->name).field_2._M_allocated_capacity = CONCAT71(uStack_37,local_38);
  }
  (this->name)._M_string_length = local_40;
  return;
}

Assistant:

holder(std::string n) : name{lower_string(n)}
    {
    }